

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O1

exr_result_t save_m44d(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  int32_t isz;
  exr_attr_m44d_t tmp;
  undefined4 local_94;
  undefined1 local_90 [128];
  
  memcpy(local_90,(a->field_6).box2i,0x80);
  local_94 = 0x80;
  eVar1 = (*ctxt->do_write)(ctxt,&local_94,4,&ctxt->output_file_offset);
  if (eVar1 == 0) {
    eVar1 = (*ctxt->do_write)(ctxt,local_90,0x80,&ctxt->output_file_offset);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_m44d (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t    rv;
    exr_attr_m44d_t tmp = *(a->m44d);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_m44d_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_64 (ctxt, &tmp, 16);
    return rv;
}